

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void ssl_calc_verify_ssl(mbedtls_ssl_context *ssl,uchar *hash)

{
  uchar *output;
  uchar pad_2 [48];
  uchar pad_1 [48];
  mbedtls_md5_context md5;
  mbedtls_sha1_context sha1;
  uchar local_148 [100];
  mbedtls_md5_context local_e4;
  mbedtls_sha1_context local_8c;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3c1,"=> calc verify ssl");
  mbedtls_md5_init(&local_e4);
  mbedtls_sha1_init(&local_8c);
  mbedtls_md5_clone(&local_e4,&ssl->handshake->fin_md5);
  mbedtls_sha1_clone(&local_8c,&ssl->handshake->fin_sha1);
  builtin_memcpy(local_148 + 0x50,"6666666666666666",0x10);
  builtin_memcpy(local_148 + 0x40,"6666666666666666",0x10);
  builtin_memcpy(local_148 + 0x30,"6666666666666666",0x10);
  builtin_memcpy(local_148,
                 "\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\\"
                 ,0x30);
  mbedtls_md5_update(&local_e4,ssl->session_negotiate->master,0x30);
  mbedtls_md5_update(&local_e4,local_148 + 0x30,0x30);
  mbedtls_md5_finish(&local_e4,hash);
  mbedtls_md5_starts(&local_e4);
  mbedtls_md5_update(&local_e4,ssl->session_negotiate->master,0x30);
  mbedtls_md5_update(&local_e4,local_148,0x30);
  mbedtls_md5_update(&local_e4,hash,0x10);
  mbedtls_md5_finish(&local_e4,hash);
  mbedtls_sha1_update(&local_8c,ssl->session_negotiate->master,0x30);
  mbedtls_sha1_update(&local_8c,local_148 + 0x30,0x28);
  output = hash + 0x10;
  mbedtls_sha1_finish(&local_8c,output);
  mbedtls_sha1_starts(&local_8c);
  mbedtls_sha1_update(&local_8c,ssl->session_negotiate->master,0x30);
  mbedtls_sha1_update(&local_8c,local_148,0x28);
  mbedtls_sha1_update(&local_8c,output,0x14);
  mbedtls_sha1_finish(&local_8c,output);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3e0,"calculated verify result",hash,0x24);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3e1,"<= calc verify");
  mbedtls_md5_free(&local_e4);
  mbedtls_sha1_free(&local_8c);
  return;
}

Assistant:

void ssl_calc_verify_ssl( mbedtls_ssl_context *ssl, unsigned char hash[36] )
{
    mbedtls_md5_context md5;
    mbedtls_sha1_context sha1;
    unsigned char pad_1[48];
    unsigned char pad_2[48];

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc verify ssl" ) );

    mbedtls_md5_init( &md5 );
    mbedtls_sha1_init( &sha1 );

    mbedtls_md5_clone( &md5, &ssl->handshake->fin_md5 );
    mbedtls_sha1_clone( &sha1, &ssl->handshake->fin_sha1 );

    memset( pad_1, 0x36, 48 );
    memset( pad_2, 0x5C, 48 );

    mbedtls_md5_update( &md5, ssl->session_negotiate->master, 48 );
    mbedtls_md5_update( &md5, pad_1, 48 );
    mbedtls_md5_finish( &md5, hash );

    mbedtls_md5_starts( &md5 );
    mbedtls_md5_update( &md5, ssl->session_negotiate->master, 48 );
    mbedtls_md5_update( &md5, pad_2, 48 );
    mbedtls_md5_update( &md5, hash,  16 );
    mbedtls_md5_finish( &md5, hash );

    mbedtls_sha1_update( &sha1, ssl->session_negotiate->master, 48 );
    mbedtls_sha1_update( &sha1, pad_1, 40 );
    mbedtls_sha1_finish( &sha1, hash + 16 );

    mbedtls_sha1_starts( &sha1 );
    mbedtls_sha1_update( &sha1, ssl->session_negotiate->master, 48 );
    mbedtls_sha1_update( &sha1, pad_2, 40 );
    mbedtls_sha1_update( &sha1, hash + 16, 20 );
    mbedtls_sha1_finish( &sha1, hash + 16 );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calculated verify result", hash, 36 );
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc verify" ) );

    mbedtls_md5_free(  &md5  );
    mbedtls_sha1_free( &sha1 );

    return;
}